

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O0

int32 find_threshold(hashelement_t **triphonehash)

{
  cmd_ln_t *pcVar1;
  long lVar2;
  void *ptr;
  void *ptr_00;
  long lVar3;
  int local_50;
  uint local_48;
  int32 ceiling;
  int32 threshold;
  int32 unique;
  int32 cnt;
  int32 i;
  int32 *lcountofcounts;
  int32 *countofcounts;
  int32 maxtph;
  int32 mincnt;
  int32 ltottph;
  int32 tottph;
  hashelement_t *triphone_el;
  hashelement_t **triphonehash_local;
  
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-minocc");
  local_48 = (uint)lVar2;
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-maxtriphones");
  if ((int)local_48 < 10000) {
    local_50 = 10000;
  }
  else {
    local_50 = local_48 + 1;
  }
  ceiling = 0;
  maxtph = 0;
  mincnt = 0;
  ptr = __ckd_calloc__((long)(local_50 + 1),4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                       ,0x267);
  ptr_00 = __ckd_calloc__((long)(local_50 + 1),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                          ,0x268);
  for (unique = 0; unique < 0x5dc1; unique = unique + 1) {
    for (_ltottph = triphonehash[unique]; _ltottph != (hashelement_t *)0x0;
        _ltottph = _ltottph->next) {
      threshold = _ltottph->count;
      if (0 < threshold) {
        mincnt = threshold + mincnt;
        if ((int)local_48 <= threshold) {
          maxtph = maxtph + 1;
          if (local_50 < threshold) {
            threshold = local_50;
          }
          *(int *)((long)ptr_00 + (long)threshold * 4) =
               *(int *)((long)ptr_00 + (long)threshold * 4) + 1;
        }
        *(int *)((long)ptr + (long)threshold * 4) = *(int *)((long)ptr + (long)threshold * 4) + 1;
        ceiling = ceiling + 1;
      }
    }
  }
  for (; (int)lVar2 < maxtph; maxtph = maxtph - *(int *)((long)ptr_00 + lVar3 * 4)) {
    lVar3 = (long)(int)local_48;
    local_48 = local_48 + 1;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x280,"%d triphones extracted from transcripts\n",(ulong)(uint)mincnt);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x281,"%d unique triphones extracted from transcripts\n",(ulong)(uint)ceiling);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x282,"%d triphones occur once in the transcripts\n",(ulong)*(uint *)((long)ptr + 4));
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x283,"%d triphones occur twice in the transcripts\n",(ulong)*(uint *)((long)ptr + 8));
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x284,"%d triphones occur thrice in the transcripts\n",(ulong)*(uint *)((long)ptr + 0xc))
  ;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x285,"The rest of the triphones occur more than three times\n");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x286,"Count threshold is %d\n",(ulong)local_48);
  ckd_free(ptr_00);
  ckd_free(ptr);
  return local_48;
}

Assistant:

int32 find_threshold(hashelement_t  **triphonehash)
{
    hashelement_t *triphone_el;
    int32 tottph, ltottph, mincnt, maxtph, *countofcounts, *lcountofcounts;
    int32 i, cnt, unique, threshold, ceiling;

    mincnt = cmd_ln_int32("-minocc");
    maxtph = cmd_ln_int32("-maxtriphones");

    ceiling = mincnt < CEILING ? CEILING : mincnt+1;

    tottph = ltottph = unique = 0;
    countofcounts = (int32 *) ckd_calloc(ceiling+1,sizeof(int32));
    lcountofcounts = (int32 *) ckd_calloc(ceiling+1,sizeof(int32));
    for (i = 0; i < HASHSIZE; i++){
	triphone_el = triphonehash[i];
	while (triphone_el != NULL){
	    cnt = triphone_el->count;
	    if (cnt > 0) {
	        tottph += cnt;
	        if (cnt >= mincnt) {
	            ltottph ++;
		    if (cnt > ceiling) cnt = ceiling;
		    lcountofcounts[cnt]++;
	        }
	        countofcounts[cnt]++; unique++;
	    }
	    triphone_el = triphone_el->next;
	}
    }

    threshold = mincnt; 
    while (ltottph > maxtph) {
	ltottph -= lcountofcounts[threshold];
	threshold++;
    }

    E_INFO("%d triphones extracted from transcripts\n",tottph);
    E_INFO("%d unique triphones extracted from transcripts\n",unique);
    E_INFO("%d triphones occur once in the transcripts\n",countofcounts[1]);
    E_INFO("%d triphones occur twice in the transcripts\n",countofcounts[2]);
    E_INFO("%d triphones occur thrice in the transcripts\n",countofcounts[3]);
    E_INFO("The rest of the triphones occur more than three times\n");
    E_INFO("Count threshold is %d\n",threshold);

    ckd_free(lcountofcounts); ckd_free(countofcounts);
    return(threshold);
}